

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileSystemWatcher_inotify.cpp
# Opt level: O2

void __thiscall FileSystemWatcher::notifyReadyRead(FileSystemWatcher *this)

{
  mutex *__mutex;
  int *key;
  int iVar1;
  uint uVar2;
  bool bVar3;
  ssize_t sVar4;
  char *pcVar5;
  Type type;
  int iVar6;
  int s;
  Path path;
  int local_11d0;
  undefined1 local_11c8 [16];
  undefined1 local_11b8 [16];
  undefined1 local_11a8 [16];
  undefined1 local_1198 [16];
  undefined1 local_1188 [8];
  Log log;
  Log local_1170;
  Log local_1160;
  Log local_1150;
  Log local_1140 [2];
  Log local_1120;
  Log local_1110;
  Log local_1100;
  Log local_10f0;
  Log local_10e0;
  Log local_10d0;
  Log local_10c0;
  Log local_10b0;
  Log local_10a0;
  Log local_1090;
  Log local_1080;
  Log local_1070;
  Log local_1060;
  Log local_1050;
  StackBuffer<4096UL,_char> buf;
  
  if (notifyReadyRead()::dumpFS == '\0') {
    iVar6 = __cxa_guard_acquire(&notifyReadyRead()::dumpFS);
    if (iVar6 != 0) {
      pcVar5 = getenv("RTAGS_DUMP_INOTIFY");
      if ((pcVar5 == (char *)0x0) || (*pcVar5 != '1')) {
        notifyReadyRead::dumpFS = false;
      }
      else {
        notifyReadyRead::dumpFS = pcVar5[1] == '\0';
      }
      __cxa_guard_release(&notifyReadyRead()::dumpFS);
    }
  }
  if (notifyReadyRead::dumpFS == true) {
    error();
    Log::operator<<(&local_1110,buf.mStackBuffer);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_1110.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(buf.mStackBuffer + 8));
  }
  __mutex = &this->mMutex;
  std::mutex::lock(__mutex);
  s = 0;
  ioctl(this->mFd,0x541b,&s);
  if ((long)s == 0) {
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  }
  else {
    StackBuffer<4096UL,_char>::StackBuffer(&buf,(long)s);
    sVar4 = read(this->mFd,buf.mBuffer,(long)s);
    for (iVar6 = 0; local_11d0 = (int)sVar4, iVar6 < local_11d0; iVar6 = iVar6 + iVar1 + 0x10) {
      key = (int *)(buf.mBuffer + iVar6);
      iVar1 = *(int *)(buf.mBuffer + (long)iVar6 + 0xc);
      Map<int,_Path,_std::less<int>_>::value(&path,&this->mWatchedById,key);
      if (path.super_String.mString._M_string_length != 0) {
        if ((notifyReadyRead::dumpFS == true) && (key[1] != 0)) {
          local_1188 = (undefined1  [8])0x1;
          Log::Log(&log,LogLevel::Error,(Flags<LogOutput::LogFlag> *)local_1188);
          Log::Log((Log *)local_1198,&log);
          operator+((String *)local_1140,(String *)&path,(char *)(key + 4));
          operator<<(&local_1120,(String *)local_1198);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&local_1120.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
          std::__cxx11::string::~string((string *)local_1140);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_1198 + 8));
          uVar2 = key[1];
          if ((uVar2 & 1) != 0) {
            Log::operator<<(local_1140,(char *)&log);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      (&local_1140[0].mData.
                        super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
          }
          if ((uVar2 & 2) != 0) {
            Log::operator<<(&local_1050,(char *)&log);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      (&local_1050.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount);
          }
          if ((uVar2 & 4) != 0) {
            Log::operator<<(&local_1060,(char *)&log);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      (&local_1060.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount);
          }
          if ((uVar2 & 8) != 0) {
            Log::operator<<(&local_1070,(char *)&log);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      (&local_1070.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount);
          }
          if ((uVar2 & 0x10) != 0) {
            Log::operator<<(&local_1080,(char *)&log);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      (&local_1080.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount);
          }
          if ((uVar2 & 0x18) != 0) {
            Log::operator<<(&local_1090,(char *)&log);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      (&local_1090.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount);
          }
          if ((uVar2 & 0x20) != 0) {
            Log::operator<<(&local_10a0,(char *)&log);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      (&local_10a0.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount);
          }
          if ((uVar2 & 0x40) != 0) {
            Log::operator<<(&local_10b0,(char *)&log);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      (&local_10b0.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount);
          }
          if ((char)uVar2 < '\0') {
            Log::operator<<(&local_10c0,(char *)&log);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      (&local_10c0.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount);
          }
          if ((uVar2 >> 8 & 1) != 0) {
            Log::operator<<(&local_10d0,(char *)&log);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      (&local_10d0.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount);
          }
          if ((uVar2 >> 9 & 1) != 0) {
            Log::operator<<(&local_10e0,(char *)&log);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      (&local_10e0.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount);
          }
          if ((uVar2 >> 10 & 1) != 0) {
            Log::operator<<(&local_10f0,(char *)&log);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      (&local_10f0.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount);
          }
          if ((uVar2 >> 0xb & 1) != 0) {
            Log::operator<<(&local_1100,(char *)&log);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      (&local_1100.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount);
          }
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&log.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
        }
        bVar3 = Path::isDir(&path);
        uVar2 = key[1];
        type = Remove;
        if ((uVar2 & 0x2c00) == 0) {
          if ((uVar2 & 0x180) == 0) {
            if ((uVar2 & 0x240) == 0) {
              if ((uVar2 & 0xc) != 0) {
                if (bVar3) {
                  String::append((String *)&path,(char *)(key + 4),0xffffffffffffffff);
                }
                std::_Rb_tree<Path,Path,std::_Identity<Path>,std::less<Path>,std::allocator<Path>>::
                _M_insert_unique<Path_const&>
                          ((_Rb_tree<Path,Path,std::_Identity<Path>,std::less<Path>,std::allocator<Path>>
                            *)&this->mModifiedPaths,&path);
              }
              goto LAB_0018d04a;
            }
            if (bVar3) {
              String::append((String *)&path,(char *)(key + 4),0xffffffffffffffff);
              type = Remove;
            }
          }
          else {
            type = Add;
            if (bVar3) {
              String::append((String *)&path,(char *)(key + 4),0xffffffffffffffff);
              type = Add;
            }
          }
        }
        add(this,type,&path);
      }
LAB_0018d04a:
      std::__cxx11::string::~string((string *)&path);
    }
    if (notifyReadyRead::dumpFS == true) {
      if ((this->mAddedPaths).super_set<Path,_std::less<Path>,_std::allocator<Path>_>._M_t._M_impl.
          super__Rb_tree_header._M_node_count != 0) {
        error();
        Log::operator<<((Log *)local_11a8,(char *)&path);
        operator<<(&local_1150,(Set<Path> *)local_11a8);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_1150.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_11a8 + 8));
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                   &path.super_String.mString._M_string_length);
      }
      if ((this->mRemovedPaths).super_set<Path,_std::less<Path>,_std::allocator<Path>_>._M_t._M_impl
          .super__Rb_tree_header._M_node_count != 0) {
        error();
        Log::operator<<((Log *)local_11b8,(char *)&path);
        operator<<(&local_1160,(Set<Path> *)local_11b8);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_1160.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_11b8 + 8));
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                   &path.super_String.mString._M_string_length);
      }
      if ((this->mModifiedPaths).super_set<Path,_std::less<Path>,_std::allocator<Path>_>._M_t.
          _M_impl.super__Rb_tree_header._M_node_count != 0) {
        error();
        Log::operator<<((Log *)local_11c8,(char *)&path);
        operator<<(&local_1170,(Set<Path> *)local_11c8);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_1170.mData.super___shared_ptr<Log::Data,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_11c8 + 8));
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                   &path.super_String.mString._M_string_length);
      }
    }
    StackBuffer<4096UL,_char>::~StackBuffer(&buf);
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    processChanges(this);
  }
  return;
}

Assistant:

void FileSystemWatcher::notifyReadyRead()
{
    static const bool dumpFS = getenv("RTAGS_DUMP_INOTIFY") && !strcmp(getenv("RTAGS_DUMP_INOTIFY"), "1");
    if (dumpFS) {
        error() << "FileSystemWatcher::notifyReadyRead";
    }
    {
        std::lock_guard<std::mutex> lock(mMutex);
        int s = 0;
        ioctl(mFd, FIONREAD, &s);
        if (!s)
            return;

        StackBuffer<4096> buf(s);
        const int read = ::read(mFd, buf, s);
        int idx = 0;
        while (idx < read) {
            inotify_event *event = reinterpret_cast<inotify_event*>(buf + idx);
            idx += sizeof(inotify_event) + event->len;
            Path path = mWatchedById.value(event->wd);
            if (path.isEmpty())
                continue;

            if (dumpFS && event->mask) {
                Log log(LogLevel::Error);
                log << (path + event->name);
                dump(log, event->mask);
            }

            const bool isDir = path.isDir();

            if (event->mask & (IN_DELETE_SELF|IN_MOVE_SELF|IN_UNMOUNT)) {
                add(Remove, path);
            } else if (event->mask & (IN_CREATE|IN_MOVED_TO)) {
                if (isDir)
                    path.append(event->name);
                add(Add, path);
            } else if (event->mask & (IN_DELETE|IN_MOVED_FROM)) {
                if (isDir)
                    path.append(event->name);
                add(Remove, path);
            } else if (event->mask & (IN_ATTRIB|IN_CLOSE_WRITE)) {
                if (isDir)
                    path.append(event->name);
                add(Modified, path);
            }
        }
        if (dumpFS) {
            if (!mAddedPaths.isEmpty())
                error() << "Added" << mAddedPaths;
            if (!mRemovedPaths.isEmpty())
                error() << "Removed" << mRemovedPaths;
            if (!mModifiedPaths.isEmpty())
                error() << "Modified" << mModifiedPaths;
        }
    }
    processChanges();
}